

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Klex.cpp
# Opt level: O0

string * __thiscall Klex::parseOutSymbol_abi_cxx11_(string *__return_storage_ptr__,Klex *this)

{
  int iVar1;
  long lVar2;
  char cVar3;
  allocator<char> local_79;
  string local_78 [8];
  string equSecondSymbols;
  allocator<char> local_41;
  string local_40 [8];
  string equFirstSymbols;
  Klex *this_local;
  string *lexeme;
  
  equFirstSymbols.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"=",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,"!><+-*/%^",&local_79);
  std::allocator<char>::~allocator(&local_79);
  getChar(this);
  cVar3 = (char)__return_storage_ptr__;
  std::__cxx11::string::push_back(cVar3);
  iVar1 = getChar(this);
  if (iVar1 == 0x3c) {
    nextChar(this);
    iVar1 = getChar(this);
    if (iVar1 == 0x2d) {
      getChar(this);
      std::__cxx11::string::push_back(cVar3);
      nextChar(this);
    }
  }
  else {
    iVar1 = getChar(this);
    if (iVar1 == 0x3d) {
      nextChar(this);
      iVar1 = getChar(this);
      lVar2 = std::__cxx11::string::find((char)local_40,(ulong)(uint)(int)(char)iVar1);
      if (lVar2 != -1) {
        getChar(this);
        std::__cxx11::string::push_back(cVar3);
        nextChar(this);
      }
    }
    else {
      iVar1 = getChar(this);
      lVar2 = std::__cxx11::string::find((char)local_78,(ulong)(uint)(int)(char)iVar1);
      if (lVar2 == -1) {
        nextChar(this);
      }
      else {
        nextChar(this);
        iVar1 = getChar(this);
        if (iVar1 == 0x3d) {
          getChar(this);
          std::__cxx11::string::push_back(cVar3);
          nextChar(this);
        }
      }
    }
  }
  equFirstSymbols.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  if ((equFirstSymbols.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Klex::parseOutSymbol() {
    std::string lexeme;

    std::string equFirstSymbols = "=";
    std::string equSecondSymbols = "!><+-*/%^";

    lexeme.push_back(getChar());

    if(getChar() == '<')  {
        nextChar();
        if(getChar() == '-') {
            lexeme.push_back(getChar());
            nextChar();
        }
    } else if(getChar() == '=') {
        nextChar();
        if(equFirstSymbols.find(getChar()) != -1) {
            lexeme.push_back(getChar());
            nextChar();
        }
    } else if(equSecondSymbols.find(getChar()) != -1) {
        nextChar();
        if(getChar() == '=') {
            lexeme.push_back(getChar());
            nextChar();
        }
    } else {
        nextChar();
    }

    return lexeme;
}